

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

uint8_t __thiscall
icu_63::Normalizer2Impl::getPreviousTrailCC(Normalizer2Impl *this,uint8_t *start,uint8_t *p)

{
  uint16_t uVar1;
  uint local_30;
  int local_2c;
  UChar32 c;
  int32_t i;
  uint8_t *p_local;
  uint8_t *start_local;
  Normalizer2Impl *this_local;
  
  if (start == p) {
    this_local._7_1_ = '\0';
  }
  else {
    local_2c = ((int)p - (int)start) + -1;
    local_30 = (uint)start[local_2c];
    _c = p;
    p_local = start;
    start_local = (uint8_t *)this;
    if ((start[local_2c] & 0x80) != 0) {
      local_30 = utf8_prevCharSafeBody_63(start,0,&local_2c,local_30,-1);
    }
    uVar1 = getFCD16(this,local_30);
    this_local._7_1_ = (uint8_t)uVar1;
  }
  return this_local._7_1_;
}

Assistant:

uint8_t Normalizer2Impl::getPreviousTrailCC(const uint8_t *start, const uint8_t *p) const {
    if (start == p) {
        return 0;
    }
    int32_t i = (int32_t)(p - start);
    UChar32 c;
    U8_PREV(start, 0, i, c);
    return (uint8_t)getFCD16(c);
}